

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableLoadSettings(ImGuiTable *table)

{
  ImGuiContext *pIVar1;
  ImGuiTableColumnIdx IVar2;
  char cVar3;
  int iVar4;
  ImGuiTableColumn *pIVar5;
  char *pcVar6;
  long in_RDI;
  bool bVar7;
  int column_n_2;
  int column_n_1;
  ImU64 expected_display_order_mask;
  ImGuiTableColumn *column;
  int column_n;
  int data_n;
  ImU64 display_order_mask;
  ImGuiTableColumnSettings *column_settings;
  ImGuiTableSettings *settings;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  ulong local_50;
  int local_48;
  int local_44;
  int local_2c;
  ulong local_28;
  ImGuiTableColumnSettings *local_20;
  ImGuiTableSettings *local_18;
  
  pIVar1 = GImGui;
  *(undefined1 *)(in_RDI + 0x20f) = 0;
  if ((*(uint *)(in_RDI + 4) & 0x10) == 0) {
    if (*(int *)(in_RDI + 0x6c) == -1) {
      local_18 = TableSettingsFindByID
                           (CONCAT13(in_stack_ffffffffffffffaf,
                                     CONCAT12(in_stack_ffffffffffffffae,in_stack_ffffffffffffffac)))
      ;
      if (local_18 == (ImGuiTableSettings *)0x0) {
        return;
      }
      if ((int)local_18->ColumnsCount != *(int *)(in_RDI + 0x74)) {
        *(undefined1 *)(in_RDI + 0x210) = 1;
      }
      iVar4 = ImChunkStream<ImGuiTableSettings>::offset_from_ptr(&pIVar1->SettingsTables,local_18);
      *(int *)(in_RDI + 0x6c) = iVar4;
    }
    else {
      local_18 = TableGetBoundSettings
                           ((ImGuiTable *)
                            CONCAT17(in_stack_ffffffffffffffaf,
                                     CONCAT16(in_stack_ffffffffffffffae,
                                              CONCAT24(in_stack_ffffffffffffffac,
                                                       in_stack_ffffffffffffffa8))));
    }
    *(ImGuiTableFlags *)(in_RDI + 0x68) = local_18->SaveFlags;
    *(float *)(in_RDI + 0xec) = local_18->RefScale;
    local_20 = ImGuiTableSettings::GetColumnSettings(local_18);
    local_28 = 0;
    for (local_2c = 0; local_2c < local_18->ColumnsCount; local_2c = local_2c + 1) {
      cVar3 = local_20->Index;
      iVar4 = (int)cVar3;
      if ((-1 < iVar4) && (iVar4 < *(int *)(in_RDI + 0x74))) {
        pIVar5 = ImSpan<ImGuiTableColumn>::operator[]
                           ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),iVar4);
        if ((local_18->SaveFlags & 1U) != 0) {
          if (((byte)local_20->field_0xb >> 3 & 1) == 0) {
            pIVar5->WidthRequest = local_20->WidthOrWeight;
          }
          else {
            pIVar5->StretchWeight = local_20->WidthOrWeight;
          }
          pIVar5->AutoFitQueue = '\0';
        }
        if ((local_18->SaveFlags & 2U) == 0) {
          pIVar5->DisplayOrder = cVar3;
        }
        else {
          pIVar5->DisplayOrder = local_20->DisplayOrder;
        }
        local_28 = 1L << (pIVar5->DisplayOrder & 0x3fU) | local_28;
        bVar7 = ((byte)local_20->field_0xb >> 2 & 1) != 0;
        pIVar5->IsUserEnabledNextFrame = bVar7;
        pIVar5->IsUserEnabled = bVar7;
        pIVar5->SortOrder = local_20->SortOrder;
        pIVar5->field_0x65 = pIVar5->field_0x65 & 0xfc | local_20->field_0xb & 3;
      }
      local_20 = local_20 + 1;
    }
    if (local_18->ColumnsCount == '@') {
      local_50 = 0xffffffffffffffff;
    }
    else {
      local_50 = (1L << (local_18->ColumnsCount & 0x3fU)) - 1;
    }
    if (local_28 != local_50) {
      for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x74); local_44 = local_44 + 1) {
        IVar2 = (ImGuiTableColumnIdx)local_44;
        pIVar5 = ImSpan<ImGuiTableColumn>::operator[]
                           ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),local_44);
        pIVar5->DisplayOrder = IVar2;
      }
    }
    for (local_48 = 0; local_48 < *(int *)(in_RDI + 0x74); local_48 = local_48 + 1) {
      cVar3 = (char)local_48;
      pIVar5 = ImSpan<ImGuiTableColumn>::operator[]
                         ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),local_48);
      pcVar6 = ImSpan<signed_char>::operator[]
                         ((ImSpan<signed_char> *)(in_RDI + 0x28),(int)pIVar5->DisplayOrder);
      *pcVar6 = cVar3;
    }
  }
  return;
}

Assistant:

void ImGui::TableLoadSettings(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    table->IsSettingsRequestLoad = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind settings
    ImGuiTableSettings* settings;
    if (table->SettingsOffset == -1)
    {
        settings = TableSettingsFindByID(table->ID);
        if (settings == NULL)
            return;
        if (settings->ColumnsCount != table->ColumnsCount) // Allow settings if columns count changed. We could otherwise decide to return...
            table->IsSettingsDirty = true;
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    else
    {
        settings = TableGetBoundSettings(table);
    }

    table->SettingsLoadedFlags = settings->SaveFlags;
    table->RefScale = settings->RefScale;

    // Serialize ImGuiTableSettings/ImGuiTableColumnSettings into ImGuiTable/ImGuiTableColumn
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();
    ImU64 display_order_mask = 0;
    for (int data_n = 0; data_n < settings->ColumnsCount; data_n++, column_settings++)
    {
        int column_n = column_settings->Index;
        if (column_n < 0 || column_n >= table->ColumnsCount)
            continue;

        ImGuiTableColumn* column = &table->Columns[column_n];
        if (settings->SaveFlags & ImGuiTableFlags_Resizable)
        {
            if (column_settings->IsStretch)
                column->StretchWeight = column_settings->WidthOrWeight;
            else
                column->WidthRequest = column_settings->WidthOrWeight;
            column->AutoFitQueue = 0x00;
        }
        if (settings->SaveFlags & ImGuiTableFlags_Reorderable)
            column->DisplayOrder = column_settings->DisplayOrder;
        else
            column->DisplayOrder = (ImGuiTableColumnIdx)column_n;
        display_order_mask |= (ImU64)1 << column->DisplayOrder;
        column->IsUserEnabled = column->IsUserEnabledNextFrame = column_settings->IsEnabled;
        column->SortOrder = column_settings->SortOrder;
        column->SortDirection = column_settings->SortDirection;
    }

    // Validate and fix invalid display order data
    const ImU64 expected_display_order_mask = (settings->ColumnsCount == 64) ? ~0 : ((ImU64)1 << settings->ColumnsCount) - 1;
    if (display_order_mask != expected_display_order_mask)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
            table->Columns[column_n].DisplayOrder = (ImGuiTableColumnIdx)column_n;

    // Rebuild index
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        table->DisplayOrderToIndex[table->Columns[column_n].DisplayOrder] = (ImGuiTableColumnIdx)column_n;
}